

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v5::internal::fp::fp<double>(fp *this,double d)

{
  unsigned_long uVar1;
  uint local_48;
  unsigned_long biased_e;
  unsigned_long u;
  int exponent_bias;
  uint64_t exponent_mask;
  uint64_t significand_mask;
  int exponent_size;
  int double_size;
  double d_local;
  fp *this_local;
  
  _exponent_size = d;
  d_local = (double)this;
  uVar1 = bit_cast<unsigned_long,double>((double *)&exponent_size);
  local_48 = (uint)((uVar1 & 0x7ff0000000000000) >> 0x34);
  this->f = uVar1 & 0xfffffffffffff;
  if ((uVar1 & 0x7ff0000000000000) == 0) {
    local_48 = 1;
  }
  else {
    this->f = this->f + 0x10000000000000;
  }
  this->e = local_48 - 0x433;
  return;
}

Assistant:

explicit fp(Double d) {
    // Assume double is in the format [sign][exponent][significand].
    typedef std::numeric_limits<Double> limits;
    const int double_size = static_cast<int>(sizeof(Double) * char_size);
    const int exponent_size =
      double_size - double_significand_size - 1;  // -1 for sign
    const uint64_t significand_mask = implicit_bit - 1;
    const uint64_t exponent_mask = (~0ull >> 1) & ~significand_mask;
    const int exponent_bias = (1 << exponent_size) - limits::max_exponent - 1;
    auto u = bit_cast<uint64_t>(d);
    auto biased_e = (u & exponent_mask) >> double_significand_size;
    f = u & significand_mask;
    if (biased_e != 0)
      f += implicit_bit;
    else
      biased_e = 1;  // Subnormals use biased exponent 1 (min exponent).
    e = static_cast<int>(biased_e - exponent_bias - double_significand_size);
  }